

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context,
          CaseDefinition caseDef)

{
  size_type *psVar1;
  TessPrimitiveType primitiveType;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var2;
  undefined8 uVar3;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  pointer pfVar4;
  Allocation *pAVar5;
  undefined8 obj;
  bool bVar6;
  int iVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  deUint32 stride;
  uint uVar12;
  InstanceInterface *pIVar13;
  VkPhysicalDevice pVVar14;
  DeviceInterface *vk;
  VkDevice pVVar15;
  float (*pafVar16) [3];
  TextureFormat TVar17;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  GraphicsPipelineBuilder *pGVar18;
  const_iterator cVar19;
  long *plVar20;
  undefined8 *puVar21;
  float *pfVar22;
  long lVar23;
  ConstPixelBufferAccess *access;
  ulong *puVar24;
  float *outer;
  uint uVar25;
  uint uVar26;
  void *__buf;
  uint z;
  ulong uVar27;
  ulong uVar28;
  VkDeviceSize VVar29;
  byte bVar30;
  int j;
  uint uVar31;
  char *pcVar32;
  undefined1 *puVar33;
  long lVar34;
  undefined4 *puVar35;
  int iVar36;
  float fVar37;
  ostringstream *poVar38;
  tessellation *this_03;
  float fVar39;
  float fVar40;
  float fVar41;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  uint local_9ec;
  vector<float,_std::allocator<float>_> attributes;
  IVec2 renderSize;
  key_type local_998;
  VkDevice local_978;
  undefined8 local_970;
  key_type local_968;
  VkCommandBuffer local_948;
  long *plStack_940;
  float local_938 [2];
  float afStack_930 [2];
  TestStatus *local_928;
  Allocator *local_920;
  Context *local_918;
  long *local_910;
  undefined8 local_908;
  long local_900;
  undefined8 uStack_8f8;
  long *local_8f0;
  undefined8 local_8e8;
  long local_8e0;
  undefined8 uStack_8d8;
  ulong *local_8d0;
  long local_8c8;
  ulong local_8c0;
  long lStack_8b8;
  ulong *local_8b0;
  long local_8a8;
  ulong local_8a0;
  long lStack_898;
  ulong *local_890;
  long local_888;
  ulong local_880;
  long lStack_878;
  ulong *local_870;
  long local_868;
  ulong local_860;
  long lStack_858;
  deUint32 local_84c;
  ulong *local_848;
  long local_840;
  ulong local_838 [2];
  ulong *local_828;
  long local_820;
  ulong local_818 [2];
  ulong *local_808;
  long local_800;
  ulong local_7f8 [2];
  ulong *local_7e8;
  long local_7e0;
  ulong local_7d8 [2];
  TextureFormat local_7c8;
  int iStack_7c0;
  int iStack_7bc;
  int local_7b8;
  int local_7ac;
  void *local_7a8;
  ulong local_7a0;
  ulong local_798;
  ConstPixelBufferAccess imagePixelAccess;
  float choices [6] [3];
  float local_6fc;
  ios_base local_6f0 [132];
  deUint32 local_66c;
  bool local_668;
  VkPrimitiveTopology local_664;
  undefined1 *local_5e8;
  undefined8 local_5e0;
  undefined1 local_5d8;
  undefined7 uStack_5d7;
  undefined1 *local_5c8;
  undefined8 local_5c0;
  undefined1 local_5b8;
  undefined7 uStack_5b7;
  long local_5a8;
  long *plStack_5a0;
  float local_598 [2];
  float afStack_590 [2];
  VkRenderPass local_588;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_580;
  VkQueue local_560;
  VkPipelineLayout local_558;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_550;
  VkDescriptorSetLayout local_538;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_530;
  Image colorAttachmentImage;
  Buffer resultBuffer;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_460;
  VkCommandPool local_448;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_440;
  VkFramebuffer local_428;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_420;
  VkImageView local_408;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_400;
  VkDescriptorPool local_3e8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_3e0;
  Buffer colorBuffer;
  Vec4 white;
  Vec4 black;
  Buffer vertexBuffer;
  VkDescriptorBufferInfo resultBufferInfo;
  key_type local_330 [3];
  ios_base local_2c0 [264];
  Vec4 clearColor;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  
  local_928 = __return_storage_ptr__;
  pIVar13 = Context::getInstanceInterface((Context *)this);
  pVVar14 = Context::getPhysicalDevice((Context *)this);
  requireFeatures(pIVar13,pVVar14,9);
  iVar7 = (int)pVVar14;
  vk = Context::getDeviceInterface((Context *)this);
  pVVar15 = Context::getDevice((Context *)this);
  local_560 = Context::getUniversalQueue((Context *)this);
  local_84c = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_920 = Context::getDefaultAllocator((Context *)this);
  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pafVar16 = choices;
  lVar23 = 0;
  do {
    lVar34 = 0;
    do {
      puVar35 = (undefined4 *)(&DAT_00b764e4 + lVar34);
      if (lVar34 == 0) {
        puVar35 = &tessellation::(anonymous_namespace)::genAttributes(bool)::baseTessLevels + lVar23
        ;
      }
      if ((caseDef._0_8_ >> 0x28 & 1) == 0) {
        puVar35 = &tessellation::(anonymous_namespace)::genAttributes(bool)::baseTessLevels + lVar23
        ;
      }
      *(undefined4 *)((long)*pafVar16 + lVar34) = *puVar35;
      lVar34 = lVar34 + 4;
    } while (lVar34 != 0xc);
    lVar23 = lVar23 + 1;
    pafVar16 = pafVar16 + 1;
  } while (lVar23 != 6);
  local_978 = pVVar15;
  local_918 = context;
  local_7a0 = (ulong)context >> 0x20;
  local_798 = caseDef._0_8_;
  iVar7 = intPow(3,iVar7);
  fVar39 = (float)iVar7;
  fVar41 = 2.0 / fVar39;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 0.0;
  iVar36 = 0;
  local_970 = (ulong)local_970._4_4_ << 0x20;
  do {
    clearColor.m_data._8_8_ = clearColor.m_data._8_8_ & 0xffffffff;
    fVar8 = 0.0;
    do {
      local_1a8[0]._M_allocated_capacity = (pointer)0x0;
      iVar9 = 0;
      do {
        local_1a8[0]._M_allocated_capacity = local_1a8[0]._M_allocated_capacity & 0xffffffff;
        iVar10 = 0;
        do {
          clearColor.m_data[0] = 0.0;
          clearColor.m_data[1] = 0.0;
          fVar11 = 0.0;
          do {
            clearColor.m_data._0_8_ = clearColor.m_data._0_8_ & 0xffffffff;
            fVar37 = 0.0;
            do {
              pafVar16 = choices;
              lVar23 = 0;
              do {
                if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&attributes,
                             (iterator)
                             attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                             *pafVar16 + (int)clearColor.m_data[lVar23]);
                }
                else {
                  *attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = (*pafVar16)[(int)clearColor.m_data[lVar23]];
                  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                lVar23 = lVar23 + 1;
                pafVar16 = pafVar16 + 1;
              } while (lVar23 != 6);
              if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_330[0]._M_dataplus._M_p._0_4_ = fVar41;
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&attributes,
                           (iterator)
                           attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)local_330);
              }
              else {
                *attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = fVar41;
                attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_330[0]._M_dataplus._M_p._0_4_ = fVar41;
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&attributes,
                           (iterator)
                           attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)local_330);
              }
              else {
                *attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = fVar41;
                attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              fVar40 = (float)(iVar36 % iVar7) / fVar39;
              local_330[0]._M_dataplus._M_p._0_4_ = fVar40 + fVar40 + -1.0;
              if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&attributes,
                           (iterator)
                           attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)local_330);
              }
              else {
                *attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_330[0]._M_dataplus._M_p._0_4_;
                attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              fVar40 = (float)(iVar36 / iVar7) / fVar39;
              local_330[0]._M_dataplus._M_p._0_4_ = fVar40 + fVar40 + -1.0;
              if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&attributes,
                           (iterator)
                           attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)local_330);
              }
              else {
                *attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_330[0]._M_dataplus._M_p._0_4_;
                attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              uVar28 = local_7a0;
              iVar36 = iVar36 + 1;
              fVar37 = (float)((int)fVar37 + 1);
              clearColor.m_data[1] = fVar37;
            } while (fVar37 != 4.2039e-45);
            fVar11 = (float)((int)fVar11 + 1);
            clearColor.m_data[1] = 4.2039e-45;
            clearColor.m_data[0] = fVar11;
          } while (fVar11 != 4.2039e-45);
          iVar10 = iVar10 + 1;
          local_1a8[0]._4_4_ = iVar10;
        } while (iVar10 != 3);
        iVar9 = iVar9 + 1;
        local_1a8[0]._4_4_ = 3;
        local_1a8[0]._0_4_ = iVar9;
      } while (iVar9 != 3);
      fVar8 = (float)((int)fVar8 + 1);
      clearColor.m_data[3] = fVar8;
    } while (fVar8 != 4.2039e-45);
    clearColor.m_data[2] = (float)((int)local_970 + 1);
    clearColor.m_data[3] = 4.2039e-45;
    local_970 = CONCAT44(local_970._4_4_,clearColor.m_data[2]);
  } while (clearColor.m_data[2] != 4.2039e-45);
  uVar25 = (uint)((ulong)((long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                          (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                .super__Vector_impl_data._M_start >> 2) / 10);
  primitiveType = (TessPrimitiveType)local_918;
  if ((int)uVar25 < 1) {
    iVar7 = 0;
  }
  else {
    uVar27 = (ulong)(uVar25 & 0x7fffffff);
    iVar7 = 0;
    iVar36 = 2;
    do {
      iVar9 = referenceVertexCount
                        (primitiveType,(SpacingMode)uVar28,true,
                         attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + (iVar36 + -2),
                         attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + iVar36);
      iVar7 = iVar7 + iVar9;
      iVar36 = iVar36 + 10;
      uVar27 = uVar27 - 1;
    } while (uVar27 != 0);
  }
  if (0 < (int)uVar25) {
    uVar28 = (ulong)(uVar25 & 0x7fffffff);
    lVar23 = 0x200000000;
    do {
      isPatchDiscarded(primitiveType,
                       (float *)((lVar23 >> 0x1e) +
                                (long)attributes.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start));
      lVar23 = lVar23 + 0xa00000000;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
  }
  TVar17 = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  stride = tcu::getPixelSize(TVar17);
  VVar29 = (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
  makeBufferCreateInfo((VkBufferCreateInfo *)choices,VVar29,0x80);
  pVVar15 = local_978;
  tessellation::Buffer::Buffer
            (&vertexBuffer,vk,local_978,local_920,(VkBufferCreateInfo *)choices,
             (MemoryRequirement)0x1);
  pAVar5 = vertexBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memcpy((vertexBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,
         attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start,VVar29);
  ::vk::flushMappedMemoryRange
            (vk,pVVar15,(VkDeviceMemory)(pAVar5->m_memory).m_internal,pAVar5->m_offset,VVar29);
  makeBufferCreateInfo((VkBufferCreateInfo *)choices,4,0x20);
  tessellation::Buffer::Buffer
            (&resultBuffer,vk,pVVar15,local_920,(VkBufferCreateInfo *)choices,(MemoryRequirement)0x1
            );
  *(undefined4 *)
   (resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr)->m_hostPtr = 0;
  ::vk::flushMappedMemoryRange
            (vk,pVVar15,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)choices,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  Image::Image(&colorAttachmentImage,vk,pVVar15,local_920,(VkImageCreateInfo *)choices,
               (MemoryRequirement)0x0);
  iVar9 = renderSize.m_data[1] * renderSize.m_data[0];
  TVar17 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar36 = tcu::getPixelSize(TVar17);
  VVar29 = (VkDeviceSize)(iVar9 * iVar36);
  makeBufferCreateInfo((VkBufferCreateInfo *)choices,VVar29,2);
  tessellation::Buffer::Buffer
            (&colorBuffer,vk,pVVar15,local_920,(VkBufferCreateInfo *)choices,(MemoryRequirement)0x1)
  ;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)choices);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)choices,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,4,
                       (VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&clearColor,this_00,vk,pVVar15,0);
  DStack_530.m_device = (VkDevice)local_1a8[0]._0_8_;
  DStack_530.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
  local_538.m_internal._0_4_ = clearColor.m_data[0];
  local_538.m_internal._4_4_ = clearColor.m_data[1];
  DStack_530.m_deviceIface = (DeviceInterface *)clearColor.m_data._8_8_;
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 0.0;
  local_1a8[0]._M_allocated_capacity = (pointer)0x0;
  local_1a8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if (choices[4]._0_8_ != 0) {
    operator_delete((void *)choices[4]._0_8_,choices[5]._4_8_ - choices[4]._0_8_);
  }
  if (choices[2]._0_8_ != 0) {
    operator_delete((void *)choices[2]._0_8_,choices[3]._4_8_ - choices[2]._0_8_);
  }
  if (choices[0]._0_8_ != 0) {
    operator_delete((void *)choices[0]._0_8_,choices[1]._4_8_ - choices[0]._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&clearColor);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&clearColor,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pVVar15 = local_978;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)choices,this_01,vk,local_978,1,1);
  DStack_3e0.m_device = (VkDevice)choices[1]._4_8_;
  DStack_3e0.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_3e8.m_internal._0_4_ = choices[0][0];
  local_3e8.m_internal._4_4_ = choices[0][1];
  DStack_3e0.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = 0.0;
  choices[1][0] = 0.0;
  choices[1][1] = 0.0;
  choices[1][2] = 0.0;
  choices[2][0] = 0.0;
  choices[2][1] = 0.0;
  if (clearColor.m_data._0_8_ != 0) {
    operator_delete((void *)clearColor.m_data._0_8_,
                    local_1a8[0]._M_allocated_capacity - clearColor.m_data._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)choices,vk,pVVar15,local_3e8,local_538)
  ;
  local_598[0] = choices[1][1];
  local_598[1] = choices[1][2];
  afStack_590[0] = choices[2][0];
  afStack_590[1] = choices[2][1];
  local_5a8._0_4_ = choices[0][0];
  local_5a8._4_4_ = choices[0][1];
  plStack_5a0 = (long *)choices._8_8_;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)choices);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)choices,(int)(float)local_5a8,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,local_978);
  if (choices[4]._0_8_ != 0) {
    operator_delete((void *)choices[4]._0_8_,choices[5]._4_8_ - choices[4]._0_8_);
  }
  if (choices[2]._0_8_ != 0) {
    operator_delete((void *)choices[2]._0_8_,choices[3]._4_8_ - choices[2]._0_8_);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)choices);
  pVVar15 = local_978;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)choices,vk,local_978,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  DStack_400.m_device = (VkDevice)choices[1]._4_8_;
  DStack_400.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_408.m_internal._0_4_ = choices[0][0];
  local_408.m_internal._4_4_ = choices[0][1];
  DStack_400.m_deviceIface = (DeviceInterface *)choices._8_8_;
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)choices,vk,pVVar15,
                 VK_FORMAT_R8G8B8A8_UNORM);
  DStack_580.m_device = (VkDevice)choices[1]._4_8_;
  DStack_580.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_588.m_internal._0_4_ = choices[0][0];
  local_588.m_internal._4_4_ = choices[0][1];
  DStack_580.m_deviceIface = (DeviceInterface *)choices._8_8_;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)choices,vk,pVVar15,
                  (VkRenderPass)choices[0]._0_8_,local_408,renderSize.m_data[0],renderSize.m_data[1]
                  ,1);
  DStack_420.m_device = (VkDevice)choices[1]._4_8_;
  DStack_420.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_428.m_internal._0_4_ = choices[0][0];
  local_428.m_internal._4_4_ = choices[0][1];
  DStack_420.m_deviceIface = (DeviceInterface *)choices._8_8_;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)choices,vk,pVVar15,local_538);
  DStack_550.m_device = (VkDevice)choices[1]._4_8_;
  DStack_550.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_558.m_internal._0_4_ = choices[0][0];
  local_558.m_internal._4_4_ = choices[0][1];
  DStack_550.m_deviceIface = (DeviceInterface *)choices._8_8_;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)choices,vk,pVVar15,local_84c);
  DStack_440.m_device = (VkDevice)choices[1]._4_8_;
  DStack_440.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_448.m_internal._0_4_ = choices[0][0];
  local_448.m_internal._4_4_ = choices[0][1];
  DStack_440.m_deviceIface = (DeviceInterface *)choices._8_8_;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)choices,vk,pVVar15,(VkCommandPool)choices[0]._0_8_,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_938[0] = choices[1][1];
  local_938[1] = choices[1][2];
  afStack_930[0] = choices[2][0];
  afStack_930[1] = choices[2][1];
  local_948 = (VkCommandBuffer)choices[0]._0_8_;
  plStack_940 = (long *)choices._8_8_;
  pIVar13 = Context::getInstanceInterface((Context *)this);
  pVVar14 = Context::getPhysicalDevice((Context *)this);
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)choices,pIVar13,pVVar14);
  memset((GraphicsPipelineBuilder *)choices,0,0xfc);
  local_668 = false;
  local_664 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  choices[0][0] = (float)renderSize.m_data[0];
  choices[0][1] = (float)renderSize.m_data[1];
  local_66c = 10;
  pGVar18 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      ((GraphicsPipelineBuilder *)choices,VK_FORMAT_R32_SFLOAT,stride);
  p_Var2 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             **)(this + 0x10);
  local_330[0]._M_dataplus._M_p = (pointer)&local_330[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"vert","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,local_330);
  pVVar15 = local_978;
  pGVar18 = GraphicsPipelineBuilder::setShader
                      (pGVar18,vk,local_978,VK_SHADER_STAGE_VERTEX_BIT,
                       *(ProgramBinary **)(cVar19._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var2 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             **)(this + 0x10);
  TVar17 = (TextureFormat)(imagePixelAccess.m_size.m_data + 2);
  imagePixelAccess.m_format = TVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imagePixelAccess,"tesc","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,(key_type *)&imagePixelAccess);
  pGVar18 = GraphicsPipelineBuilder::setShader
                      (pGVar18,vk,pVVar15,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                       *(ProgramBinary **)(cVar19._M_node + 2),(VkSpecializationInfo *)0x0);
  bVar30 = local_6fc != 0.0 & (byte)(local_798 >> 0x20) & 1;
  p_Var2 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             **)(this + 0x10);
  pcVar32 = "tese";
  if (bVar30 != 0) {
    pcVar32 = "tese_psw";
  }
  local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_998,pcVar32,pcVar32 + (ulong)bVar30 * 4 + 4);
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,&local_998);
  pGVar18 = GraphicsPipelineBuilder::setShader
                      (pGVar18,vk,pVVar15,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                       *(ProgramBinary **)(cVar19._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var2 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             **)(this + 0x10);
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"frag","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,&local_968);
  pGVar18 = GraphicsPipelineBuilder::setShader
                      (pGVar18,vk,pVVar15,VK_SHADER_STAGE_FRAGMENT_BIT,
                       *(ProgramBinary **)(cVar19._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&clearColor,pGVar18,vk,pVVar15,local_558,
             local_588);
  obj = clearColor.m_data._0_8_;
  DStack_460.m_device = (VkDevice)local_1a8[0]._0_8_;
  DStack_460.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
  DStack_460.m_deviceIface = (DeviceInterface *)clearColor.m_data._8_8_;
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 0.0;
  local_1a8[0]._M_allocated_capacity = (pointer)0x0;
  local_1a8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
  }
  if (imagePixelAccess.m_format != TVar17) {
    operator_delete((void *)imagePixelAccess.m_format,
                    CONCAT44(imagePixelAccess.m_pitch.m_data[0],imagePixelAccess.m_size.m_data[2]) +
                    1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
    operator_delete(local_330[0]._M_dataplus._M_p,local_330[0].field_2._M_allocated_capacity + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)choices);
  choices[0]._0_8_ = *(undefined8 *)(*(long *)this + 0x10);
  poVar38 = (ostringstream *)(choices[0] + 2);
  std::__cxx11::ostringstream::ostringstream(poVar38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar38,"Note: rendering ",0x10);
  std::ostream::operator<<(poVar38,uVar25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar38," patches; first patches have valid relevant outer levels, ",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar38,
             "but later patches have one or more invalid (i.e. less than or equal to 0.0) relevant outer levels"
             ,0x61);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar38);
  std::ios_base::~ios_base(local_6f0);
  beginCommandBuffer(vk,local_948);
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)choices,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_948,1,0x80,0,0,0,0,0,1,(int)(VkImageMemoryBarrier *)choices);
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = (float)renderSize.m_data[0];
  choices[1][0] = (float)renderSize.m_data[1];
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 1.0;
  beginRenderPass(vk,local_948,local_588,local_428,(VkRect2D *)choices,&clearColor);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,local_948,0,obj);
  (*vk->_vptr_DeviceInterface[0x56])(vk,local_948,0,local_558.m_internal,0,1,&local_5a8,0,0);
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_948,0,1,&vertexBuffer);
  (*vk->_vptr_DeviceInterface[0x59])
            (vk,local_948,
             (ulong)((long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2,1,0,0);
  endRenderPass(vk,local_948);
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)choices,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_948,0x400,0x1000,0,0,0,0,0,1,(int)(VkImageMemoryBarrier *)choices);
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)choices,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_948,
             colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
             object.m_internal,6,
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)(VkBufferImageCopy *)choices);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)choices,0x1000,0x2000,
             (VkBuffer)
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,VVar29);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_948,0x1000,0x4000,0,0,0,1,(VkBufferMemoryBarrier *)choices,0,0);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)choices,0x40,0x2000,
             (VkBuffer)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,4);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_948,0x8000,0x4000,0,0,0,1,(VkBufferMemoryBarrier *)choices,0,0);
  endCommandBuffer(vk,local_948);
  pVVar15 = local_978;
  submitCommandsAndWait(vk,local_978,local_560,local_948);
  pAVar5 = colorBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,pVVar15,
             (VkDeviceMemory)
             ((colorBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,VVar29);
  choices[0]._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&imagePixelAccess,(TextureFormat *)choices,renderSize.m_data[0],renderSize.m_data[1],1,
             pAVar5->m_hostPtr);
  uVar3 = *(undefined8 *)(*(long *)this + 0x10);
  clearColor.m_data._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&clearColor,"color0","");
  local_330[0]._M_dataplus._M_p = (pointer)&local_330[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"Rendered image","");
  access = &imagePixelAccess;
  tcu::LogImage::LogImage
            ((LogImage *)choices,(string *)&clearColor,local_330,access,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)choices,(int)(float)uVar3,__buf,(size_t)access);
  if ((float (*) [3])choices._32_8_ != choices + 4) {
    operator_delete((void *)choices._32_8_,choices[4]._0_8_ + 1);
  }
  if ((float *)choices[0]._0_8_ != choices[1] + 1) {
    operator_delete((void *)choices[0]._0_8_,choices[1]._4_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
    operator_delete(local_330[0]._M_dataplus._M_p,local_330[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)clearColor.m_data._0_8_ != local_1a8) {
    operator_delete((void *)clearColor.m_data._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1))
    ;
  }
  pAVar5 = resultBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,local_978,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  iVar36 = *pAVar5->m_hostPtr;
  choices[0]._0_8_ = uVar3;
  if (((uint)local_918 < 2) && ((~local_798 & 0x10100000000) == 0 && local_7a0 == 1)) {
    poVar38 = (ostringstream *)(choices[0] + 2);
    std::__cxx11::ostringstream::ostringstream(poVar38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar38,"Note: shader invocations generated ",0x23);
    std::ostream::operator<<(poVar38,iVar36);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar38,
               " vertices (not verified as number of vertices is implementation-dependent)",0x4a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (iVar36 < iVar7) {
      poVar38 = (ostringstream *)(choices[0] + 2);
      std::__cxx11::ostringstream::ostringstream(poVar38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar38,"Failure: expected ",0x12);
      std::ostream::operator<<(poVar38,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar38," vertices from shader invocations, but got only ",0x30);
      std::ostream::operator<<(poVar38,iVar36);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar38);
      std::ios_base::~ios_base(local_6f0);
      choices[0]._0_8_ = choices[1] + 1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)choices,"Wrong number of tessellation coordinates","");
      local_928->m_code = QP_TEST_RESULT_FAIL;
      (local_928->m_description)._M_dataplus._M_p = (pointer)&(local_928->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_928->m_description,choices[0]._0_8_,
                 choices._8_8_ + choices[0]._0_8_);
      goto LAB_007b24a2;
    }
    poVar38 = (ostringstream *)(choices[0] + 2);
    if (iVar36 - iVar7 == 0) {
      std::__cxx11::ostringstream::ostringstream(poVar38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar38,"Note: shader invocations generated ",0x23);
      std::ostream::operator<<(poVar38,iVar36);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar38," vertices",9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(poVar38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar38,"Note: shader invocations generated ",0x23);
      std::ostream::operator<<(poVar38,iVar36);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar38," vertices (expected ",0x14);
      std::ostream::operator<<(poVar38,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar38,", got ",6);
      std::ostream::operator<<(poVar38,iVar36 - iVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar38," extra)",7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(choices[0] + 2));
  std::ios_base::~ios_base(local_6f0);
  local_7c8 = imagePixelAccess.m_format;
  iStack_7c0 = imagePixelAccess.m_size.m_data[0];
  iStack_7bc = imagePixelAccess.m_size.m_data[1];
  local_7b8 = imagePixelAccess.m_size.m_data[2];
  local_7ac = imagePixelAccess.m_pitch.m_data[2];
  local_7a8 = imagePixelAccess.m_data;
  black.m_data[0] = 0.0;
  black.m_data[1] = 0.0;
  black.m_data[2] = 0.0;
  black.m_data[3] = 1.0;
  white.m_data[0] = 1.0;
  white.m_data[1] = 1.0;
  white.m_data[2] = 1.0;
  white.m_data[3] = 1.0;
  if ((int)uVar25 < 1) {
    bVar6 = true;
  }
  else {
    uVar28 = 0;
    uVar12 = 0;
    local_9ec = 0;
    iVar7 = 0;
    do {
      pfVar4 = attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar23 = (long)(uVar28 * 0xa00000000) >> 0x1e;
      bVar6 = isPatchDiscarded((TessPrimitiveType)local_918,
                               (float *)((long)attributes.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start + lVar23 + 8
                                        ));
      fVar39 = white.m_data[0];
      if (bVar6) {
        local_970 = uVar28;
        if (0 < iStack_7bc) {
          iVar36 = 0;
          do {
            bVar6 = 0 < iStack_7c0;
            iVar9 = 0xe;
            if (0 < iStack_7c0) {
              iVar10 = 0;
              bVar6 = true;
              fVar39 = black.m_data[0];
              do {
                if (((int)uVar12 < iVar36) || ((int)local_9ec < iVar36 && iVar7 < iVar10)) {
                  tcu::ConstPixelBufferAccess::getPixel
                            ((ConstPixelBufferAccess *)choices,(int)&local_7c8,iVar10,iVar36);
                  if ((choices[0][0] == fVar39) && (!NAN(choices[0][0]) && !NAN(fVar39))) {
                    uVar28 = 0xffffffffffffffff;
                    while (uVar28 != 2) {
                      lVar23 = uVar28 + 2;
                      uVar27 = uVar28 + 1;
                      lVar34 = uVar28 + 2;
                      if ((choices[0][lVar23] != black.m_data[lVar34]) ||
                         (uVar28 = uVar27, NAN(choices[0][lVar23]) || NAN(black.m_data[lVar34])))
                      goto LAB_007b15a6;
                    }
                    uVar27 = 3;
LAB_007b15a6:
                    if (2 < uVar27) goto LAB_007b15ac;
                  }
                  clearColor.m_data._0_8_ = uVar3;
                  std::__cxx11::ostringstream::ostringstream
                            ((ostringstream *)(clearColor.m_data + 2));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(clearColor.m_data + 2),
                             "Failure: expected all pixels to be black in the area ",0x35);
                  iVar9 = iStack_7c0 + -1;
                  if (iVar7 < iVar9) {
                    local_5c8 = &local_5b8;
                    local_5c0 = 0;
                    local_5b8 = 0;
                    plVar20 = (long *)std::__cxx11::string::append((char *)&local_5c8);
                    local_8b0 = &local_8a0;
                    puVar24 = (ulong *)(plVar20 + 2);
                    if ((ulong *)*plVar20 == puVar24) {
                      local_8a0 = *puVar24;
                      lStack_898 = plVar20[3];
                    }
                    else {
                      local_8a0 = *puVar24;
                      local_8b0 = (ulong *)*plVar20;
                    }
                    local_8a8 = plVar20[1];
                    *plVar20 = (long)puVar24;
                    plVar20[1] = 0;
                    *(undefined1 *)(plVar20 + 2) = 0;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
                    std::ostream::operator<<(local_330,uVar12);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
                    std::ios_base::~ios_base(local_2c0);
                    uVar28 = 0xf;
                    if (local_8b0 != &local_8a0) {
                      uVar28 = local_8a0;
                    }
                    if (uVar28 < (ulong)(local_7e0 + local_8a8)) {
                      uVar28 = 0xf;
                      if (local_7e8 != local_7d8) {
                        uVar28 = local_7d8[0];
                      }
                      if (uVar28 < (ulong)(local_7e0 + local_8a8)) goto LAB_007b17ce;
                      puVar21 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_7e8,0,(char *)0x0,(ulong)local_8b0);
                    }
                    else {
LAB_007b17ce:
                      puVar21 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_8b0,(ulong)local_7e8)
                      ;
                    }
                    local_910 = &local_900;
                    plVar20 = puVar21 + 2;
                    if ((long *)*puVar21 == plVar20) {
                      local_900 = *plVar20;
                      uStack_8f8 = puVar21[3];
                    }
                    else {
                      local_900 = *plVar20;
                      local_910 = (long *)*puVar21;
                    }
                    local_908 = puVar21[1];
                    *puVar21 = plVar20;
                    puVar21[1] = 0;
                    *(undefined1 *)plVar20 = 0;
                    plVar20 = (long *)std::__cxx11::string::append((char *)&local_910);
                    local_890 = &local_880;
                    puVar24 = (ulong *)(plVar20 + 2);
                    if ((ulong *)*plVar20 == puVar24) {
                      local_880 = *puVar24;
                      lStack_878 = plVar20[3];
                    }
                    else {
                      local_880 = *puVar24;
                      local_890 = (ulong *)*plVar20;
                    }
                    local_888 = plVar20[1];
                    *plVar20 = (long)puVar24;
                    plVar20[1] = 0;
                    *(undefined1 *)(plVar20 + 2) = 0;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
                    std::ostream::operator<<(local_330,local_9ec);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
                    std::ios_base::~ios_base(local_2c0);
                    uVar28 = 0xf;
                    if (local_890 != &local_880) {
                      uVar28 = local_880;
                    }
                    if (uVar28 < (ulong)(local_800 + local_888)) {
                      uVar28 = 0xf;
                      if (local_808 != local_7f8) {
                        uVar28 = local_7f8[0];
                      }
                      if (uVar28 < (ulong)(local_800 + local_888)) goto LAB_007b1a72;
                      puVar21 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_808,0,(char *)0x0,(ulong)local_890);
                    }
                    else {
LAB_007b1a72:
                      puVar21 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_890,(ulong)local_808)
                      ;
                    }
                    local_8f0 = &local_8e0;
                    plVar20 = puVar21 + 2;
                    if ((long *)*puVar21 == plVar20) {
                      local_8e0 = *plVar20;
                      uStack_8d8 = puVar21[3];
                    }
                    else {
                      local_8e0 = *plVar20;
                      local_8f0 = (long *)*puVar21;
                    }
                    local_8e8 = puVar21[1];
                    *puVar21 = plVar20;
                    puVar21[1] = 0;
                    *(undefined1 *)plVar20 = 0;
                    plVar20 = (long *)std::__cxx11::string::append((char *)&local_8f0);
                    local_870 = &local_860;
                    puVar24 = (ulong *)(plVar20 + 2);
                    if ((ulong *)*plVar20 == puVar24) {
                      local_860 = *puVar24;
                      lStack_858 = plVar20[3];
                    }
                    else {
                      local_860 = *puVar24;
                      local_870 = (ulong *)*plVar20;
                    }
                    local_868 = plVar20[1];
                    *plVar20 = (long)puVar24;
                    plVar20[1] = 0;
                    *(undefined1 *)(plVar20 + 2) = 0;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
                    std::ostream::operator<<(local_330,iVar7);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
                    std::ios_base::~ios_base(local_2c0);
                    uVar28 = 0xf;
                    if (local_870 != &local_860) {
                      uVar28 = local_860;
                    }
                    if (uVar28 < (ulong)(local_820 + local_868)) {
                      uVar28 = 0xf;
                      if (local_828 != local_818) {
                        uVar28 = local_818[0];
                      }
                      if (uVar28 < (ulong)(local_820 + local_868)) goto LAB_007b1c30;
                      puVar21 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_828,0,(char *)0x0,(ulong)local_870);
                    }
                    else {
LAB_007b1c30:
                      puVar21 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_870,(ulong)local_828)
                      ;
                    }
                    local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
                    psVar1 = puVar21 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar21 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_968.field_2._M_allocated_capacity = *psVar1;
                      local_968.field_2._8_8_ = puVar21[3];
                    }
                    else {
                      local_968.field_2._M_allocated_capacity = *psVar1;
                      local_968._M_dataplus._M_p = (pointer)*puVar21;
                    }
                    local_968._M_string_length = puVar21[1];
                    *puVar21 = psVar1;
                    puVar21[1] = 0;
                    *(undefined1 *)psVar1 = 0;
                    puVar21 = (undefined8 *)std::__cxx11::string::append((char *)&local_968);
                  }
                  else {
                    local_5e8 = &local_5d8;
                    local_5e0 = 0;
                    local_5d8 = 0;
                    plVar20 = (long *)std::__cxx11::string::append((char *)&local_5e8);
                    local_8d0 = &local_8c0;
                    puVar24 = (ulong *)(plVar20 + 2);
                    if ((ulong *)*plVar20 == puVar24) {
                      local_8c0 = *puVar24;
                      lStack_8b8 = plVar20[3];
                    }
                    else {
                      local_8c0 = *puVar24;
                      local_8d0 = (ulong *)*plVar20;
                    }
                    local_8c8 = plVar20[1];
                    *plVar20 = (long)puVar24;
                    plVar20[1] = 0;
                    *(undefined1 *)(plVar20 + 2) = 0;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
                    std::ostream::operator<<(local_330,uVar12);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
                    std::ios_base::~ios_base(local_2c0);
                    uVar28 = 0xf;
                    if (local_8d0 != &local_8c0) {
                      uVar28 = local_8c0;
                    }
                    if (uVar28 < (ulong)(local_840 + local_8c8)) {
                      uVar28 = 0xf;
                      if (local_848 != local_838) {
                        uVar28 = local_838[0];
                      }
                      if (uVar28 < (ulong)(local_840 + local_8c8)) goto LAB_007b18c6;
                      puVar21 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_848,0,(char *)0x0,(ulong)local_8d0);
                    }
                    else {
LAB_007b18c6:
                      puVar21 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_8d0,(ulong)local_848)
                      ;
                    }
                  }
                  local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
                  psVar1 = puVar21 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar21 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_998.field_2._M_allocated_capacity = *psVar1;
                    local_998.field_2._8_8_ = puVar21[3];
                  }
                  else {
                    local_998.field_2._M_allocated_capacity = *psVar1;
                    local_998._M_dataplus._M_p = (pointer)*puVar21;
                  }
                  local_998._M_string_length = puVar21[1];
                  *puVar21 = psVar1;
                  puVar21[1] = 0;
                  *(undefined1 *)psVar1 = 0;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(clearColor.m_data + 2),local_998._M_dataplus._M_p,
                             local_998._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(clearColor.m_data + 2),
                             " (they all correspond to patches that should be discarded)",0x3a);
                  choices[0]._0_8_ =
                       tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)&clearColor,
                                  (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)(choices[0] + 2));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(choices[0] + 2),"Note: pixel ",0xc);
                  local_330[0]._M_dataplus._M_p._4_4_ = iVar36;
                  local_330[0]._M_dataplus._M_p._0_4_ = (float)iVar10;
                  tcu::operator<<((ostream *)(choices[0] + 2),(Vector<int,_2> *)local_330);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(choices[0] + 2)," isn\'t black",0xc);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage)
                  ;
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(choices[0] + 2));
                  std::ios_base::~ios_base(local_6f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_998._M_dataplus._M_p != &local_998.field_2) {
                    operator_delete(local_998._M_dataplus._M_p,
                                    local_998.field_2._M_allocated_capacity + 1);
                  }
                  if (iVar7 < iVar9) {
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_968._M_dataplus._M_p != &local_968.field_2) {
                      operator_delete(local_968._M_dataplus._M_p,
                                      local_968.field_2._M_allocated_capacity + 1);
                    }
                    if (local_828 != local_818) {
                      operator_delete(local_828,local_818[0] + 1);
                    }
                    if (local_870 != &local_860) {
                      operator_delete(local_870,local_860 + 1);
                    }
                    if (local_8f0 != &local_8e0) {
                      operator_delete(local_8f0,local_8e0 + 1);
                    }
                    if (local_808 != local_7f8) {
                      operator_delete(local_808,local_7f8[0] + 1);
                    }
                    if (local_890 != &local_880) {
                      operator_delete(local_890,local_880 + 1);
                    }
                    if (local_910 != &local_900) {
                      operator_delete(local_910,local_900 + 1);
                    }
                    if (local_7e8 != local_7d8) {
                      operator_delete(local_7e8,local_7d8[0] + 1);
                    }
                    if (local_8b0 != &local_8a0) {
                      operator_delete(local_8b0,local_8a0 + 1);
                    }
                    if (local_5c8 != &local_5b8) {
                      lVar23 = CONCAT71(uStack_5b7,local_5b8);
                      puVar33 = local_5c8;
LAB_007b1ff5:
                      operator_delete(puVar33,lVar23 + 1);
                    }
                  }
                  else {
                    if (local_848 != local_838) {
                      operator_delete(local_848,local_838[0] + 1);
                    }
                    if (local_8d0 != &local_8c0) {
                      operator_delete(local_8d0,local_8c0 + 1);
                    }
                    if (local_5e8 != &local_5d8) {
                      lVar23 = CONCAT71(uStack_5d7,local_5d8);
                      puVar33 = local_5e8;
                      goto LAB_007b1ff5;
                    }
                  }
                  std::__cxx11::ostringstream::~ostringstream
                            ((ostringstream *)(clearColor.m_data + 2));
                  std::ios_base::~ios_base(local_140);
                  iVar9 = 1;
                  break;
                }
LAB_007b15ac:
                iVar10 = iVar10 + 1;
                bVar6 = iVar10 < iStack_7c0;
              } while (iVar10 < iStack_7c0);
            }
            if (bVar6) goto LAB_007b2041;
            iVar36 = iVar36 + 1;
          } while (iVar36 < iStack_7bc);
        }
        iVar9 = 0xb;
LAB_007b2041:
        uVar28 = local_970;
        if (iVar9 == 0xb) {
          iVar9 = 2;
        }
      }
      else {
        this_03 = (tessellation *)((long)pfVar4 + lVar23);
        iVar36 = (int)((*(float *)(this_03 + 0x20) + 1.0) * 0.5 * (float)iStack_7c0) + -1;
        iVar7 = (int)((*(float *)(this_03 + 0x20) + *(float *)(this_03 + 0x18) + 1.0) * 0.5 *
                     (float)iStack_7c0) + 1;
        uVar31 = (int)((*(float *)(this_03 + 0x24) + 1.0) * 0.5 * (float)iStack_7bc) - 1;
        uVar26 = (int)((*(float *)(this_03 + 0x24) + *(float *)(this_03 + 0x1c) + 1.0) * 0.5 *
                      (float)iStack_7bc) + 1;
        if ((int)uVar12 < (int)uVar26) {
          local_9ec = uVar12;
        }
        outer = (float *)(ulong)local_9ec;
        if ((int)uVar12 < (int)uVar26) {
          uVar12 = uVar26;
        }
        if ((int)uVar31 <= (int)uVar26) {
          bVar6 = false;
          iVar9 = iVar36;
          z = uVar31;
          do {
            while ((local_970 = uVar28, iVar9 <= iVar7 && (!bVar6))) {
              if ((-1 < iVar9) && (((iVar9 < iStack_7c0 && (-1 < (int)z)) && ((int)z < iStack_7bc)))
                 ) {
                outer = (float *)(ulong)z;
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)choices,(int)&local_7c8,iVar9,z);
                if ((choices[0][0] == fVar39) && (!NAN(choices[0][0]) && !NAN(fVar39))) {
                  pfVar22 = (float *)0xffffffffffffffff;
                  while (pfVar22 != (float *)0x2) {
                    lVar23 = (long)pfVar22 + 2;
                    outer = (float *)((long)pfVar22 + 1);
                    lVar34 = (long)pfVar22 + 2;
                    if ((choices[0][lVar23] != white.m_data[lVar34]) ||
                       (pfVar22 = outer, NAN(choices[0][lVar23]) || NAN(white.m_data[lVar34])))
                    goto LAB_007b21d6;
                  }
                  outer = (float *)0x3;
LAB_007b21d6:
                  if ((float *)0x2 < outer) {
                    bVar6 = true;
                  }
                }
              }
              iVar9 = iVar9 + 1;
              uVar28 = local_970;
            }
            z = z + 1;
          } while (((int)z <= (int)uVar26) && (iVar9 = iVar36, !bVar6));
          iVar9 = 0;
          if (bVar6) goto LAB_007b23d2;
        }
        poVar38 = (ostringstream *)(clearColor.m_data + 2);
        clearColor.m_data._0_8_ = uVar3;
        std::__cxx11::ostringstream::ostringstream(poVar38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar38,"Failure: expected at least one white pixel in the rectangle "
                   ,0x3c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar38,"[x0=",4);
        std::ostream::operator<<(poVar38,iVar36);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar38,", y0=",5);
        std::ostream::operator<<(poVar38,uVar31);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar38,", x1=",5);
        std::ostream::operator<<(poVar38,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar38,", y1=",5);
        std::ostream::operator<<(poVar38,uVar26);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar38,"]",1);
        choices[0]._0_8_ =
             tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&clearColor,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(choices[0] + 2));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(choices[0] + 2),
                   "Note: the rectangle approximately corresponds to the patch with these tessellation levels: "
                   ,0x5b);
        getTessellationLevelsString_abi_cxx11_(local_330,this_03,(float *)(this_03 + 4),outer);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(choices[0] + 2),local_330[0]._M_dataplus._M_p,
                   local_330[0]._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
          operator_delete(local_330[0]._M_dataplus._M_p,
                          local_330[0].field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(choices[0] + 2));
        std::ios_base::~ios_base(local_6f0);
        std::__cxx11::ostringstream::~ostringstream(poVar38);
        std::ios_base::~ios_base(local_140);
        iVar9 = 1;
      }
LAB_007b23d2:
      if (iVar9 != 0) goto LAB_007b23eb;
      uVar28 = uVar28 + 1;
    } while (uVar28 != (uVar25 & 0x7fffffff));
    iVar9 = 2;
LAB_007b23eb:
    bVar6 = iVar9 == 2;
  }
  choices[0]._0_8_ = choices[1] + 1;
  if (bVar6) {
    std::__cxx11::string::_M_construct<char_const*>((string *)choices,"OK","");
    local_928->m_code = QP_TEST_RESULT_PASS;
    (local_928->m_description)._M_dataplus._M_p = (pointer)&(local_928->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_928->m_description,choices[0]._0_8_,choices._8_8_ + choices[0]._0_8_
              );
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)choices,"Image verification failed","");
    local_928->m_code = QP_TEST_RESULT_FAIL;
    (local_928->m_description)._M_dataplus._M_p = (pointer)&(local_928->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_928->m_description,choices[0]._0_8_,choices._8_8_ + choices[0]._0_8_
              );
  }
LAB_007b24a2:
  if ((float *)choices[0]._0_8_ != choices[1] + 1) {
    operator_delete((void *)choices[0]._0_8_,choices[1]._4_8_ + 1);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_460,(VkPipeline)obj);
  }
  if (local_948 != (VkCommandBuffer)0x0) {
    clearColor.m_data._0_8_ = local_948;
    (**(code **)(*plStack_940 + 0x240))(plStack_940,local_938,afStack_930,1);
  }
  if (local_448.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_440,local_448);
  }
  if (local_558.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_550,local_558);
  }
  if (local_428.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_420,local_428);
  }
  if (local_588.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_580,local_588);
  }
  if (local_408.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_400,local_408);
  }
  if (local_5a8 != 0) {
    clearColor.m_data[0] = (float)(undefined4)local_5a8;
    clearColor.m_data[1] = (float)local_5a8._4_4_;
    (**(code **)(*plStack_5a0 + 0x1e8))(plStack_5a0,local_598,afStack_590,1);
  }
  if (local_3e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_3e0,local_3e8);
  }
  if (local_538.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_530,local_538);
  }
  if (colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
      .m_data.ptr != (Allocation *)0x0) {
    (*(colorBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
      0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (colorAttachmentImage.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorAttachmentImage.m_allocation.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
      m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                deleter,(VkImage)colorAttachmentImage.m_image.
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                 m_internal);
  }
  if (resultBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(resultBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (vertexBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(vertexBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_928;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const std::vector<float>	attributes				= genAttributes(caseDef.useLessThanOneInnerLevels);
	const int					numAttribsPerPrimitive	= 6 + 2 + 2; // Tess levels, scale, offset.
	const int					numPrimitives			= static_cast<int>(attributes.size() / numAttribsPerPrimitive);
	const int					numExpectedVertices		= expectedVertexCount(numPrimitives, numAttribsPerPrimitive, caseDef.primitiveType, caseDef.spacingMode, attributes);

	// Check the convenience assertion that all discarded patches come after the last non-discarded patch.
	{
		bool discardedPatchEncountered = false;
		for (int patchNdx = 0; patchNdx < numPrimitives; ++patchNdx)
		{
			const bool discard = isPatchDiscarded(caseDef.primitiveType, &attributes[numAttribsPerPrimitive*patchNdx + 2]);
			DE_ASSERT(discard || !discardedPatchEncountered);
			discardedPatchEncountered = discard;
		}
		DE_UNREF(discardedPatchEncountered);
	}

	// Vertex input attributes buffer

	const VkFormat	   vertexFormat		   = VK_FORMAT_R32_SFLOAT;
	const deUint32	   vertexStride		   = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes = sizeInBytes(attributes);
	const Buffer	   vertexBuffer		   (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	DE_ASSERT(static_cast<int>(attributes.size()) == numPrimitives * numAttribsPerPrimitive);
	DE_ASSERT(sizeof(attributes[0]) == vertexStride);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &attributes[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
		// No barrier needed, flushed memory is automatically visible
	}

	// Output buffer: number of invocations

	const VkDeviceSize resultBufferSizeBytes = sizeof(deInt32);
	const Buffer	   resultBuffer			 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(256, 256);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification

	const VkDeviceSize colorBufferSizeBytes = renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer colorBuffer(vk, device, allocator,
		makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView	(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass			(makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer			(makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool				(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const bool						needPointSizeWrite	= getPhysicalDeviceFeatures(context.getInstanceInterface(), context.getPhysicalDevice()).shaderTessellationAndGeometryPointSize && caseDef.usePointMode;

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setRenderSize				  (renderSize)
		.setPatchControlPoints		  (numAttribsPerPrimitive)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get(needPointSizeWrite ? "tese_psw" : "tese"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				context.getBinaryCollection().get("frag"), DE_NULL)
		.build						  (vk, device, *pipelineLayout, *renderPass));

	context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Note: rendering " << numPrimitives << " patches; first patches have valid relevant outer levels, "
		<< "but later patches have one or more invalid (i.e. less than or equal to 0.0) relevant outer levels"
		<< tcu::TestLog::EndMessage;

	// Draw commands

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(attributes.size()), 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}
	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	{
		// Log rendered image
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);

		const tcu::ConstPixelBufferAccess imagePixelAccess(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, colorBufferAlloc.getHostPtr());

		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::TestLog::Image("color0", "Rendered image", imagePixelAccess);

		// Verify case result
		const Allocation& resultAlloc = resultBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

		const deInt32 numResultVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());

		if (!lessThanOneInnerLevelsDefined(caseDef) && caseDef.useLessThanOneInnerLevels)
		{
			// Since we cannot explicitly determine whether or not such interior vertices are going to be
			// generated, we will not verify the number of generated vertices for fractional odd + quads/triangles
			// tessellation configurations.
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices (not verified as number of vertices is implementation-dependent)"
				<< tcu::TestLog::EndMessage;
		}
		else if (numResultVertices < numExpectedVertices)
		{
			log << tcu::TestLog::Message
				<< "Failure: expected " << numExpectedVertices << " vertices from shader invocations, but got only " << numResultVertices
				<< tcu::TestLog::EndMessage;
			return tcu::TestStatus::fail("Wrong number of tessellation coordinates");
		}
		else if (numResultVertices == numExpectedVertices)
		{
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices"
				<< tcu::TestLog::EndMessage;
		}
		else
		{
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices (expected " << numExpectedVertices << ", got "
				<< (numResultVertices - numExpectedVertices) << " extra)"
				<< tcu::TestLog::EndMessage;
		}

		return (verifyResultImage(log, numPrimitives, numAttribsPerPrimitive, caseDef.primitiveType, attributes, imagePixelAccess)
				? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image verification failed"));
	}
}